

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_308a495::ReaderSpy::~ReaderSpy(ReaderSpy *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  this->super_Reader = (Reader)&PTR__ReaderSpy_00b4f328;
  pcVar2 = (this->prefix)._M_dataplus._M_p;
  paVar1 = &(this->prefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->s).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->r).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

ReaderSpy(const std::shared_ptr<dap::Reader>& r,
            const std::shared_ptr<dap::Writer>& s,
            const std::string& prefix)
      : r(r), s(s), prefix(prefix) {}